

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lstring.c
# Opt level: O0

TString * createstrobj(lua_State *L,size_t l,int tag,uint h)

{
  TString *pTVar1;
  size_t totalsize;
  GCObject *o;
  TString *ts;
  uint h_local;
  int tag_local;
  size_t l_local;
  lua_State *L_local;
  
  pTVar1 = (TString *)luaC_newobj(L,tag,l + 0x19);
  pTVar1->hash = h;
  pTVar1->extra = '\0';
  *(lu_byte *)((long)&pTVar1[1].next + l) = '\0';
  return pTVar1;
}

Assistant:

static TString *createstrobj(lua_State *L, size_t l, int tag, unsigned int h) {
    TString *ts;
    GCObject *o;
    size_t totalsize;  /* total size of TString object */
    totalsize = sizelstring(l);
    o = luaC_newobj(L, tag, totalsize);
    ts = gco2ts(o);
    ts->hash = h;
    ts->extra = 0;
    getstr(ts)[l] = '\0';  /* ending 0 */
    return ts;
}